

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_address.cpp
# Opt level: O3

void __thiscall
cfdcapi_address_CfdCreateAddressTest_Test::TestBody(cfdcapi_address_CfdCreateAddressTest_Test *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  char *message;
  char *address;
  int ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 local_58 [16];
  AssertHelper local_48;
  void *handle;
  AssertHelper local_38;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&address,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x2a9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&address,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&address);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&message,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x2aa,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&message,(Message *)&address);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_58) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (address != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (address != (char *)0x0)) {
        (**(code **)(*(long *)address + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  lVar3 = 0;
  bVar1 = true;
  do {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    address = (char *)0x0;
    ret = CfdCreateAddress(handle,7,(char *)(&DAT_00728ab0)[lVar3 * 5],"",
                           (&DAT_00728ac4)[lVar3 * 10],&address,(char **)&gtest_ar_,(char **)0x0);
    message = (char *)((ulong)message & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&message,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&message);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x2d0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&message);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (message != (char *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (message != (char *)0x0)) {
          (**(code **)(*(long *)message + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"exp_datas[idx].address","address",
                 (&PTR_anon_var_dwarf_3a779f_00728ac8)[lVar3 * 5],address);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&message);
        pcVar4 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2d2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&message);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (message != (char *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (message != (char *)0x0)) {
            (**(code **)(*(long *)message + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"exp_datas[idx].locking_script","locking_script",
                 (&PTR_anon_var_dwarf_134cc_00728ad0)[lVar3 * 5],(char *)gtest_ar_._0_8_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&message);
        pcVar4 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2d3,pcVar4);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&message);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (message != (char *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (message != (char *)0x0)) {
            (**(code **)(*(long *)message + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
      pcVar4 = address;
LAB_0027656b:
      CfdFreeStringBuffer(pcVar4);
    }
    else {
      message = (char *)0x0;
      ret = CfdGetLastErrorMessage(handle,&message);
      if (ret == 0) {
        testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","message","",message);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_48);
          pcVar4 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                     ,0x2da,pcVar4);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_48.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_48.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pcVar4 = message;
        goto LAB_0027656b;
      }
    }
    lVar3 = 1;
    bVar2 = !bVar1;
    bVar1 = false;
    if (bVar2) {
      ret = CfdFreeHandle(handle);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&address,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2e1,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&address,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  } while( true );
}

Assistant:

TEST(cfdcapi_address, CfdCreateAddressTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdCreateAddressExpectData {
    const char* pubkey;
    const char* script;
    int hash_type;
    int network;
    const char* address;
    const char* locking_script;
  };

  const struct CfdCreateAddressExpectData exp_datas[] = {
    {  // taproot testnet
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "",
      kCfdTaproot,
      kCfdNetworkTestnet,
      "tb1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naskf8ee6",
      "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb"
    },
    {  // taproot regtest
      "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
      "",
      kCfdTaproot,
      kCfdNetworkRegtest,
      "bcrt1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsn6c9jz",
      "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799"
    },
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdCreateAddressExpectData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    char* locking_script = nullptr;
    char* address = nullptr;
    ret = CfdCreateAddress(
        handle, exp_datas[idx].hash_type, exp_datas[idx].pubkey,
        exp_datas[idx].script, exp_datas[idx].network,
        &address, &locking_script, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_datas[idx].address, address);
      EXPECT_STREQ(exp_datas[idx].locking_script, locking_script);
      CfdFreeStringBuffer(locking_script);
      CfdFreeStringBuffer(address);
    } else {
      char* message = nullptr;
      ret = CfdGetLastErrorMessage(handle, &message);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("", message);
        CfdFreeStringBuffer(message);
      }
    }
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}